

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pack_dev.c
# Opt level: O0

dev_t pack_native(int n,unsigned_long *numbers,char **error)

{
  uint uVar1;
  ulonglong local_28;
  dev_t dev;
  char **error_local;
  unsigned_long *numbers_local;
  int n_local;
  
  local_28 = 0;
  if (n == 2) {
    local_28 = gnu_dev_makedev((uint)*numbers,(uint)numbers[1]);
    uVar1 = gnu_dev_major(local_28);
    if ((ulong)uVar1 == *numbers) {
      uVar1 = gnu_dev_minor(local_28);
      if ((ulong)uVar1 != numbers[1]) {
        *error = "invalid minor number";
      }
    }
    else {
      *error = "invalid major number";
    }
  }
  else {
    *error = "too many fields for format";
  }
  return local_28;
}

Assistant:

dev_t
pack_native(int n, unsigned long numbers[], const char **error)
{
	dev_t dev = 0;

	if (n == 2) {
		dev = apd_makedev(numbers[0], numbers[1]);
		if ((unsigned long)major(dev) != numbers[0])
			*error = iMajorError;
		else if ((unsigned long)minor(dev) != numbers[1])
			*error = iMinorError;
	} else
		*error = tooManyFields;
	return (dev);
}